

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata.h
# Opt level: O0

void __thiscall
QSharedDataPointer<QStyleSheetBackgroundData>::reset
          (QSharedDataPointer<QStyleSheetBackgroundData> *this,QStyleSheetBackgroundData *ptr)

{
  bool bVar1;
  QStyleSheetBackgroundData *pQVar2;
  QStyleSheetBackgroundData *in_RSI;
  QStyleSheetBackgroundData *in_RDI;
  long in_FS_OFFSET;
  QStyleSheetBackgroundData *old;
  totally_ordered_wrapper<QStyleSheetBackgroundData_*> *in_stack_ffffffffffffffb8;
  totally_ordered_wrapper<QStyleSheetBackgroundData_*> local_18;
  totally_ordered_wrapper<QStyleSheetBackgroundData_*> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = Qt::totally_ordered_wrapper<QStyleSheetBackgroundData_*>::get
                     ((totally_ordered_wrapper<QStyleSheetBackgroundData_*> *)in_RDI);
  if (in_RSI != pQVar2) {
    if (in_RSI != (QStyleSheetBackgroundData *)0x0) {
      QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x4539ec);
    }
    Qt::totally_ordered_wrapper<QStyleSheetBackgroundData_*>::totally_ordered_wrapper
              (&local_18,in_RSI);
    local_10 = std::
               exchange<Qt::totally_ordered_wrapper<QStyleSheetBackgroundData*>,Qt::totally_ordered_wrapper<QStyleSheetBackgroundData*>>
                         (in_stack_ffffffffffffffb8,
                          (totally_ordered_wrapper<QStyleSheetBackgroundData_*> *)0x453a0a);
    pQVar2 = Qt::totally_ordered_wrapper<QStyleSheetBackgroundData_*>::get(&local_10);
    if (((pQVar2 != (QStyleSheetBackgroundData *)0x0) &&
        (bVar1 = QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x453a30), !bVar1)) &&
       (pQVar2 != (QStyleSheetBackgroundData *)0x0)) {
      QStyleSheetBackgroundData::~QStyleSheetBackgroundData(in_RDI);
      operator_delete(pQVar2,0x40);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void reset(T *ptr = nullptr) noexcept
    {
        if (ptr != d.get()) {
            if (ptr)
                ptr->ref.ref();
            T *old = std::exchange(d, Qt::totally_ordered_wrapper(ptr)).get();
            if (old && !old->ref.deref())
                delete old;
        }
    }